

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::QualifiedClassName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Descriptor *d)

{
  Options *in_RCX;
  Options local_108;
  cpp *local_18;
  Descriptor *d_local;
  
  local_108.field_listener_options.forbidden_field_listener_events._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  local_108.eagerly_verified_lazy = false;
  local_108.force_eagerly_verified_lazy = false;
  local_108._234_6_ = 0;
  local_108.field_listener_options.forbidden_field_listener_events._M_t._M_impl.
  super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_108.field_listener_options.forbidden_field_listener_events._M_t._M_impl.
  super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_108.field_listener_options.forbidden_field_listener_events._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  local_108.field_listener_options.forbidden_field_listener_events._M_t._M_impl.
  super__Rb_tree_header._M_header._4_4_ = 0;
  local_108.field_listener_options.forbidden_field_listener_events._M_t._M_impl.
  super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_108.field_listener_options.inject_field_listener_events = false;
  local_108.field_listener_options._1_7_ = 0;
  local_108.field_listener_options.forbidden_field_listener_events._M_t._M_impl._0_8_ = 0;
  local_108.access_info_map = (AccessInfoMap *)0x0;
  local_108.tctable_mode = kTCTableNever;
  local_108._172_4_ = 0;
  local_108.annotation_guard_name.field_2._M_allocated_capacity = 0;
  local_108.annotation_guard_name.field_2._8_8_ = 0;
  local_108.annotation_guard_name._M_dataplus = (_Alloc_hider)0x0;
  local_108.annotation_guard_name._1_7_ = 0;
  local_108.annotation_guard_name._M_string_length = 0;
  local_108.annotation_pragma_name.field_2._M_allocated_capacity = 0;
  local_108.annotation_pragma_name.field_2._8_8_ = 0;
  local_108.annotation_pragma_name._M_dataplus = (_Alloc_hider)0x0;
  local_108.annotation_pragma_name._1_7_ = 0;
  local_108.annotation_pragma_name._M_string_length = 0;
  local_108.runtime_include_base.field_2._8_8_ = 0;
  local_108.num_cc_files = 0;
  local_108._92_4_ = 0;
  local_108.runtime_include_base._M_string_length = 0;
  local_108.runtime_include_base.field_2._M_allocated_capacity = 0;
  local_108.force_inline_string = false;
  local_108._49_7_ = 0;
  local_108.runtime_include_base._M_dataplus = (_Alloc_hider)0x0;
  local_108.runtime_include_base._1_7_ = 0;
  local_108.safe_boundary_check = false;
  local_108.proto_h = false;
  local_108.transitive_pb_h = false;
  local_108.annotate_headers = false;
  local_108.enforce_mode = kNoEnforcement;
  local_108.table_driven_parsing = false;
  local_108.table_driven_serialization = false;
  local_108.lite_implicit_weak_fields = false;
  local_108.bootstrap = false;
  local_108.opensource_runtime = false;
  local_108.annotate_accessor = false;
  local_108.unused_field_stripping = false;
  local_108.profile_driven_inline_string = false;
  local_108.dllexport_decl.field_2._M_allocated_capacity = 0;
  local_108.dllexport_decl.field_2._8_8_ = 0;
  local_108.dllexport_decl._M_dataplus = (_Alloc_hider)0x0;
  local_108.dllexport_decl._1_7_ = 0;
  local_108.dllexport_decl._M_string_length = 0;
  local_18 = this;
  d_local = (Descriptor *)__return_storage_ptr__;
  Options::Options(&local_108);
  QualifiedClassName_abi_cxx11_(__return_storage_ptr__,this,(Descriptor *)&local_108,in_RCX);
  Options::~Options(&local_108);
  return __return_storage_ptr__;
}

Assistant:

std::string QualifiedClassName(const Descriptor* d) {
  return QualifiedClassName(d, Options());
}